

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tri_seg_intersection
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_INT *face_nodes,REF_DBL *t,REF_DBL *uvw
          )

{
  uint uVar1;
  double dVar2;
  double local_e0;
  double local_d0;
  double local_c8;
  double local_b8;
  double local_b0;
  double local_a0;
  double local_98;
  double local_88;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [4];
  REF_DBL total_volume;
  REF_DBL node2_volume;
  REF_DBL node1_volume;
  REF_DBL node0_volume;
  REF_DBL *uvw_local;
  REF_DBL *t_local;
  REF_INT *face_nodes_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  
  ref_private_macro_code_rss_1 = *face_nodes;
  ref_private_macro_code_rss = face_nodes[1];
  nodes[0] = face_nodes[2];
  nodes[1] = node0;
  node0_volume = (REF_DBL)uvw;
  uvw_local = t;
  t_local = (REF_DBL *)face_nodes;
  face_nodes_local._0_4_ = node1;
  face_nodes_local._4_4_ = node0;
  _node1_local = ref_node;
  uVar1 = ref_node_tet_vol(ref_node,&ref_private_macro_code_rss_1,&node1_volume);
  if (uVar1 == 0) {
    nodes[1] = (REF_INT)face_nodes_local;
    uVar1 = ref_node_tet_vol(_node1_local,&ref_private_macro_code_rss_1,&node2_volume);
    if (uVar1 == 0) {
      nodes._8_8_ = node1_volume - node2_volume;
      if ((double)nodes._8_8_ * 1e+20 <= 0.0) {
        local_88 = -((double)nodes._8_8_ * 1e+20);
      }
      else {
        local_88 = (double)nodes._8_8_ * 1e+20;
      }
      if (node1_volume <= 0.0) {
        local_98 = -node1_volume;
      }
      else {
        local_98 = node1_volume;
      }
      if (local_98 < local_88) {
        *uvw_local = node1_volume / (double)nodes._8_8_;
        nodes[0] = face_nodes_local._4_4_;
        nodes[1] = (REF_INT)face_nodes_local;
        uVar1 = ref_node_tet_vol(_node1_local,&ref_private_macro_code_rss_1,&total_volume);
        if (uVar1 == 0) {
          ref_private_macro_code_rss_1 = *(REF_STATUS *)((long)t_local + 4);
          ref_private_macro_code_rss = *(REF_STATUS *)(t_local + 1);
          uVar1 = ref_node_tet_vol(_node1_local,&ref_private_macro_code_rss_1,&node1_volume);
          if (uVar1 == 0) {
            ref_private_macro_code_rss_1 = *(REF_STATUS *)(t_local + 1);
            ref_private_macro_code_rss = *(REF_STATUS *)t_local;
            ref_node_local._4_4_ =
                 ref_node_tet_vol(_node1_local,&ref_private_macro_code_rss_1,&node2_volume);
            if (ref_node_local._4_4_ == 0) {
              dVar2 = node1_volume + node2_volume + total_volume;
              if (dVar2 * 1e+20 <= 0.0) {
                local_a0 = -(dVar2 * 1e+20);
              }
              else {
                local_a0 = dVar2 * 1e+20;
              }
              if (node1_volume <= 0.0) {
                local_b0 = -node1_volume;
              }
              else {
                local_b0 = node1_volume;
              }
              if (local_b0 < local_a0) {
                *(double *)node0_volume = node1_volume / dVar2;
                if (dVar2 * 1e+20 <= 0.0) {
                  local_b8 = -(dVar2 * 1e+20);
                }
                else {
                  local_b8 = dVar2 * 1e+20;
                }
                if (node2_volume <= 0.0) {
                  local_c8 = -node2_volume;
                }
                else {
                  local_c8 = node2_volume;
                }
                if (local_c8 < local_b8) {
                  *(double *)((long)node0_volume + 8) = node2_volume / dVar2;
                  if (dVar2 * 1e+20 <= 0.0) {
                    local_d0 = -(dVar2 * 1e+20);
                  }
                  else {
                    local_d0 = dVar2 * 1e+20;
                  }
                  if (total_volume <= 0.0) {
                    local_e0 = -total_volume;
                  }
                  else {
                    local_e0 = total_volume;
                  }
                  if (local_e0 < local_d0) {
                    *(double *)((long)node0_volume + 0x10) = total_volume / dVar2;
                    ref_node_local._4_4_ = 0;
                  }
                  else {
                    ref_node_local._4_4_ = 4;
                  }
                }
                else {
                  ref_node_local._4_4_ = 4;
                }
              }
              else {
                ref_node_local._4_4_ = 4;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0xa29,"ref_node_tri_seg_intersection",(ulong)ref_node_local._4_4_,"face 1 vol"
                    );
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xa26,"ref_node_tri_seg_intersection",(ulong)uVar1,"face 20 vol");
            ref_node_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xa23,"ref_node_tri_seg_intersection",(ulong)uVar1,"face 2 vol");
          ref_node_local._4_4_ = uVar1;
        }
      }
      else {
        ref_node_local._4_4_ = 4;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa1c,
             "ref_node_tri_seg_intersection",(ulong)uVar1,"node 1 vol");
      ref_node_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa1a,
           "ref_node_tri_seg_intersection",(ulong)uVar1,"node 0 vol");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_seg_intersection(REF_NODE ref_node,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_INT *face_nodes,
                                                 REF_DBL *t, REF_DBL *uvw) {
  REF_DBL node0_volume, node1_volume, node2_volume, total_volume;
  REF_INT nodes[4];
  nodes[0] = face_nodes[0];
  nodes[1] = face_nodes[1];
  nodes[2] = face_nodes[2];
  nodes[3] = node0;
  RSS(ref_node_tet_vol(ref_node, nodes, &node0_volume), "node 0 vol");
  nodes[3] = node1;
  RSS(ref_node_tet_vol(ref_node, nodes, &node1_volume), "node 1 vol");
  total_volume = node0_volume - node1_volume;
  if (!ref_math_divisible(node0_volume, total_volume)) return REF_DIV_ZERO;
  *t = node0_volume / total_volume;

  nodes[2] = node0;
  nodes[3] = node1;
  RSS(ref_node_tet_vol(ref_node, nodes, &node2_volume), "face 2 vol");
  nodes[0] = face_nodes[1];
  nodes[1] = face_nodes[2];
  RSS(ref_node_tet_vol(ref_node, nodes, &node0_volume), "face 20 vol");
  nodes[0] = face_nodes[2];
  nodes[1] = face_nodes[0];
  RSS(ref_node_tet_vol(ref_node, nodes, &node1_volume), "face 1 vol");
  total_volume = node0_volume + node1_volume + node2_volume;

  if (!ref_math_divisible(node0_volume, total_volume)) return REF_DIV_ZERO;
  uvw[0] = node0_volume / total_volume;
  if (!ref_math_divisible(node1_volume, total_volume)) return REF_DIV_ZERO;
  uvw[1] = node1_volume / total_volume;
  if (!ref_math_divisible(node2_volume, total_volume)) return REF_DIV_ZERO;
  uvw[2] = node2_volume / total_volume;
  return REF_SUCCESS;
}